

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatchkit.hpp
# Opt level: O2

Type_Info * __thiscall
chaiscript::detail::Dispatch_Engine::get_type
          (Type_Info *__return_storage_ptr__,Dispatch_Engine *this,string_view name,bool t_throw)

{
  _Base_ptr p_Var1;
  const_iterator cVar2;
  range_error *this_00;
  allocator<char> local_81;
  shared_lock<chaiscript::detail::threading::shared_mutex> l;
  string_view name_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  name_local._M_str = name._M_str;
  name_local._M_len = name._M_len;
  l._M_owns = true;
  l._M_pm = &this->m_mutex;
  std::__shared_mutex_pthread::lock_shared((__shared_mutex_pthread *)this);
  cVar2 = std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,chaiscript::Type_Info>,std::_Select1st<std::pair<std::__cxx11::string_const,chaiscript::Type_Info>>,chaiscript::str_less,std::allocator<std::pair<std::__cxx11::string_const,chaiscript::Type_Info>>>
          ::_M_find_tr<std::basic_string_view<char,std::char_traits<char>>,void>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,chaiscript::Type_Info>,std::_Select1st<std::pair<std::__cxx11::string_const,chaiscript::Type_Info>>,chaiscript::str_less,std::allocator<std::pair<std::__cxx11::string_const,chaiscript::Type_Info>>>
                      *)&(this->m_state).m_types,&name_local);
  if ((_Rb_tree_header *)cVar2._M_node ==
      &(this->m_state).m_types._M_t._M_impl.super__Rb_tree_header) {
    if (t_throw) {
      this_00 = (range_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                ((string *)&local_60,&name_local,&local_81);
      std::operator+(&local_40,"Type Not Known: ",&local_60);
      std::range_error::range_error(this_00,(string *)&local_40);
      __cxa_throw(this_00,&std::range_error::typeinfo,std::range_error::~range_error);
    }
    *(undefined8 *)&__return_storage_ptr__->m_flags = 0;
    __return_storage_ptr__->m_type_info = (type_info *)&Type_Info::Unknown_Type::typeinfo;
    __return_storage_ptr__->m_bare_type_info = (type_info *)&Type_Info::Unknown_Type::typeinfo;
    __return_storage_ptr__->m_flags = 0x20;
  }
  else {
    *(_Base_ptr *)&__return_storage_ptr__->m_flags = cVar2._M_node[2]._M_left;
    p_Var1 = cVar2._M_node[2]._M_parent;
    __return_storage_ptr__->m_type_info = *(type_info **)(cVar2._M_node + 2);
    __return_storage_ptr__->m_bare_type_info = (type_info *)p_Var1;
  }
  std::shared_lock<std::shared_mutex>::~shared_lock(&l);
  return __return_storage_ptr__;
}

Assistant:

Type_Info get_type(std::string_view name, bool t_throw = true) const {
        chaiscript::detail::threading::shared_lock<chaiscript::detail::threading::shared_mutex> l(m_mutex);

        const auto itr = m_state.m_types.find(name);

        if (itr != m_state.m_types.end()) {
          return itr->second;
        }

        if (t_throw) {
          throw std::range_error("Type Not Known: " + std::string(name));
        } else {
          return Type_Info();
        }
      }